

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O1

int GmfCpyLin(int64_t InpIdx,int64_t OutIdx,int KwdCod)

{
  __jmp_buf_tag *__env;
  long lVar1;
  char cVar2;
  int iVar3;
  size_t sVar4;
  ulong uVar5;
  undefined1 *puVar6;
  int iVar7;
  float *wrd;
  undefined1 **wrd_00;
  char *pcVar8;
  FILE *pFVar9;
  int a;
  float f;
  int64_t l;
  double d;
  char s [256];
  float local_160;
  float local_15c;
  __jmp_buf_tag *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  long local_140;
  undefined1 local_138 [264];
  
  __env = (__jmp_buf_tag *)(InpIdx + 0x48);
  iVar3 = _setjmp(__env);
  iVar7 = 0;
  if (iVar3 == 0) {
    local_140 = (long)KwdCod;
    lVar1 = InpIdx + local_140 * 0x3300;
    local_158 = __env;
    if (0 < *(int *)(lVar1 + 0x11c)) {
      uVar5 = 0;
      do {
        cVar2 = *(char *)(lVar1 + 0x10e8 + uVar5);
        if (cVar2 == 'c') {
          memset(local_138,0,0x100);
          if ((*(byte *)(InpIdx + 0xc) & 1) == 0) {
            sVar4 = fread(local_138,4,0x40,*(FILE **)(InpIdx + 0x300410));
            if (sVar4 != 0x40) {
              longjmp(local_158,-3);
            }
          }
          else {
            iVar3 = __isoc99_fscanf(*(undefined8 *)(InpIdx + 0x300410),"%s",local_138);
            if (iVar3 != 1) goto LAB_001096a2;
          }
          if ((*(byte *)(OutIdx + 0xc) & 1) == 0) {
            fwrite(local_138,4,0x40,*(FILE **)(OutIdx + 0x300410));
          }
          else {
            pFVar9 = *(FILE **)(OutIdx + 0x300410);
            pcVar8 = "%s ";
            puVar6 = local_138;
LAB_00109620:
            fprintf(pFVar9,pcVar8,puVar6);
          }
        }
        else if (cVar2 == 'i') {
          if (*(int *)(InpIdx + 4) < 4) {
            if ((*(byte *)(InpIdx + 0xc) & 1) == 0) {
              ScaWrd((GmfMshSct *)InpIdx,&local_160);
            }
            else {
              iVar3 = __isoc99_fscanf(*(undefined8 *)(InpIdx + 0x300410),"%d",&local_160);
              if (iVar3 != 1) {
LAB_001096a2:
                longjmp(local_158,-1);
              }
            }
            local_150 = (undefined1 *)(long)(int)local_160;
          }
          else {
            if ((*(byte *)(InpIdx + 0xc) & 1) == 0) {
              ScaDblWrd((GmfMshSct *)InpIdx,&local_150);
            }
            else {
              iVar3 = __isoc99_fscanf(*(undefined8 *)(InpIdx + 0x300410),"%ld",&local_150);
              if (iVar3 != 1) goto LAB_001096a2;
            }
            local_160 = local_150._0_4_;
          }
          if ((uVar5 == *(int *)(lVar1 + 0x11c) - 1) && (GmfMaxRefTab[local_140] < (int)local_160))
          {
            GmfMaxRefTab[local_140] = (int)local_160;
          }
          if (*(int *)(OutIdx + 4) < 4) {
            if ((*(byte *)(OutIdx + 0xc) & 1) == 0) {
              wrd = &local_160;
LAB_001095d0:
              RecWrd((GmfMshSct *)OutIdx,wrd);
            }
            else {
              fprintf(*(FILE **)(OutIdx + 0x300410),"%d ",(ulong)(uint)local_160);
            }
          }
          else {
            if ((*(byte *)(OutIdx + 0xc) & 1) != 0) {
              pFVar9 = *(FILE **)(OutIdx + 0x300410);
              pcVar8 = "%ld ";
              puVar6 = local_150;
              goto LAB_00109620;
            }
            wrd_00 = &local_150;
LAB_001095e9:
            RecDblWrd((GmfMshSct *)OutIdx,wrd_00);
          }
        }
        else if (cVar2 == 'r') {
          if (*(int *)(InpIdx + 0x18) == 0x20) {
            if ((*(byte *)(InpIdx + 0xc) & 1) == 0) {
              ScaWrd((GmfMshSct *)InpIdx,&local_15c);
            }
            else {
              iVar3 = __isoc99_fscanf(*(undefined8 *)(InpIdx + 0x300410),"%f",&local_15c);
              if (iVar3 != 1) goto LAB_001096a2;
            }
            local_148 = (undefined1 *)(double)local_15c;
          }
          else {
            if ((*(byte *)(InpIdx + 0xc) & 1) == 0) {
              ScaDblWrd((GmfMshSct *)InpIdx,&local_148);
            }
            else {
              iVar3 = __isoc99_fscanf(*(undefined8 *)(InpIdx + 0x300410),"%lf",&local_148);
              if (iVar3 != 1) goto LAB_001096a2;
            }
            local_15c = (float)(double)local_148;
          }
          if (*(int *)(OutIdx + 0x18) == 0x20) {
            if ((*(byte *)(OutIdx + 0xc) & 1) == 0) {
              wrd = &local_15c;
              goto LAB_001095d0;
            }
            pFVar9 = *(FILE **)(OutIdx + 0x300410);
            pcVar8 = "%.9g ";
            puVar6 = (undefined1 *)(double)local_15c;
          }
          else {
            if ((*(byte *)(OutIdx + 0xc) & 1) == 0) {
              wrd_00 = &local_148;
              goto LAB_001095e9;
            }
            pFVar9 = *(FILE **)(OutIdx + 0x300410);
            pcVar8 = "%.17g ";
            puVar6 = local_148;
          }
          fprintf(pFVar9,pcVar8,puVar6);
        }
        uVar5 = uVar5 + 1;
      } while ((long)uVar5 < (long)*(int *)(lVar1 + 0x11c));
    }
    iVar7 = 1;
    if ((*(byte *)(OutIdx + 0xc) & 1) != 0) {
      fputc(10,*(FILE **)(OutIdx + 0x300410));
    }
  }
  return iVar7;
}

Assistant:

int GmfCpyLin(int64_t InpIdx, int64_t OutIdx, int KwdCod)
{
   char        s[ WrdSiz * FilStrSiz ];
   double      d;
   float       f;
   int         i, a, err;
   int64_t     l;
   GmfMshSct   *InpMsh = (GmfMshSct *)InpIdx, *OutMsh = (GmfMshSct *)OutIdx;
   KwdSct      *kwd = &InpMsh->KwdTab[ KwdCod ];

   // Save the current stack environment for longjmp
   if( (err = setjmp(InpMsh->err)) != 0)
   {
#ifdef GMFDEBUG
      printf("libMeshb : mesh %p : error %d\n", InpMsh, err);
#endif
      return(0);
   }

   for(i=0;i<kwd->SolSiz;i++)
   {
      if(kwd->fmt[i] == 'r')
      {
         if(InpMsh->FltSiz == 32)
         {
            if(InpMsh->typ & Asc)
               safe_fscanf(InpMsh->hdl, "%f", &f, InpMsh->err);
            else
               ScaWrd(InpMsh, (unsigned char *)&f);

            d = (double)f;
         }
         else
         {
            if(InpMsh->typ & Asc)
               safe_fscanf(InpMsh->hdl, "%lf", &d, InpMsh->err);
            else
               ScaDblWrd(InpMsh, (unsigned char *)&d);

            f = (float)d;
         }

         if(OutMsh->FltSiz == 32)
            if(OutMsh->typ & Asc)
               fprintf(OutMsh->hdl, "%.9g ", (double)f);
            else
               RecWrd(OutMsh, (unsigned char *)&f);
         else
            if(OutMsh->typ & Asc)
               fprintf(OutMsh->hdl, "%.17g ", d);
            else
               RecDblWrd(OutMsh, (unsigned char *)&d);
      }
      else if(kwd->fmt[i] == 'i')
      {
         if(InpMsh->ver <= 3)
         {
            if(InpMsh->typ & Asc)
               safe_fscanf(InpMsh->hdl, "%d", &a, InpMsh->err);
            else
               ScaWrd(InpMsh, (unsigned char *)&a);

            l = (int64_t)a;
         }
         else
         {
            if(InpMsh->typ & Asc)
               safe_fscanf(InpMsh->hdl, INT64_T_FMT, &l, InpMsh->err);
            else
               ScaDblWrd(InpMsh, (unsigned char *)&l);

            a = (int)l;
         }

         if( (i == kwd->SolSiz-1) && (a > GmfMaxRefTab[ KwdCod ]) )
            GmfMaxRefTab[ KwdCod ] = a;

         if(OutMsh->ver <= 3)
         {
            if(OutMsh->typ & Asc)
               fprintf(OutMsh->hdl, "%d ", a);
            else
               RecWrd(OutMsh, (unsigned char *)&a);
         }
         else
         {
            if(OutMsh->typ & Asc)
               fprintf(OutMsh->hdl, INT64_T_FMT" ", l);
            else
               RecDblWrd(OutMsh, (unsigned char *)&l);
         }
      }
      else if(kwd->fmt[i] == 'c')
      {
         memset(s, 0, FilStrSiz * WrdSiz);

         if(InpMsh->typ & Asc)
         {
            //safe_fgets(s, WrdSiz * FilStrSiz, InpMsh->hdl, InpMsh->err);
            safe_fscanf(InpMsh->hdl, "%s", s, InpMsh->err);
         }
         else
#ifdef WITH_GMF_AIO
            read(InpMsh->FilDes, s, WrdSiz * FilStrSiz);
#else
            safe_fread(s, WrdSiz, FilStrSiz, InpMsh->hdl, InpMsh->err);
#endif
         if(OutMsh->typ & Asc)
            fprintf(OutMsh->hdl, "%s ", s);
         else
#ifdef WITH_GMF_AIO
            write(OutMsh->FilDes, s, WrdSiz * FilStrSiz);
#else
            fwrite(s, WrdSiz, FilStrSiz, OutMsh->hdl);
#endif
      }
   }

   if(OutMsh->typ & Asc)
      fprintf(OutMsh->hdl, "\n");

   return(1);
}